

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *paVar1;
  allocator<unsigned_long> *paVar2;
  char *pcVar3;
  bool bVar4;
  _Setfill<char> _Var5;
  int iVar6;
  _Ios_Openmode _Var7;
  uint32_t uVar8;
  uint uVar9;
  _Setw _Var10;
  ostream *poVar11;
  long *plVar12;
  undefined8 uVar13;
  byte local_369;
  int local_324;
  int by;
  int b;
  uint local_308;
  int local_304;
  uint32_t Hash;
  int t;
  int i;
  bool DateiZuEnde;
  vector<unsigned_long,_std::allocator<unsigned_long>_> TmpArr2;
  undefined1 local_2d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> TmpArr1;
  value_type local_2b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2b0;
  undefined1 local_298 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  state_alt;
  allocator<unsigned_long> local_269;
  value_type local_268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_260;
  undefined1 local_248 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  state_main;
  char local_228 [7];
  char InputByte;
  ifstream InputDatei;
  int Hashlength;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    poVar11 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6f68);
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  }
  else {
    iVar6 = atoi(argv[1]);
    BitRate = iVar6 * -2 + 0x640;
    if ((((iVar6 == 0x200) || (iVar6 == 0x180)) || (iVar6 == 0x100)) || (iVar6 == 0xe0)) {
      pcVar3 = argv[2];
      _Var7 = std::operator|(_S_in,_S_bin);
      std::ifstream::ifstream(local_228,pcVar3,_Var7);
      local_268 = 0;
      std::allocator<unsigned_long>::allocator(&local_269);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_260,5,&local_268,&local_269);
      paVar1 = (allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               ((long)&state_alt.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
      std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator(paVar1)
      ;
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)local_248,5,&local_260,paVar1);
      std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
                ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                 ((long)&state_alt.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_260);
      std::allocator<unsigned_long>::~allocator(&local_269);
      local_2b8 = 0;
      paVar2 = (allocator<unsigned_long> *)
               ((long)&TmpArr1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<unsigned_long>::allocator(paVar2);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_2b0,5,&local_2b8,paVar2);
      paVar1 = (allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               ((long)&TmpArr1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6);
      std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator(paVar1)
      ;
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)local_298,5,&local_2b0,paVar1);
      std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
                ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                 ((long)&TmpArr1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2b0);
      std::allocator<unsigned_long>::~allocator
                ((allocator<unsigned_long> *)
                 ((long)&TmpArr1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      paVar2 = (allocator<unsigned_long> *)
               ((long)&TmpArr2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<unsigned_long>::allocator(paVar2);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,5,paVar2);
      std::allocator<unsigned_long>::~allocator
                ((allocator<unsigned_long> *)
                 ((long)&TmpArr2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&t + 3));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,5,
                 (allocator<unsigned_long> *)((long)&t + 3));
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&t + 3));
      t._2_1_ = 0;
      while (((t._2_1_ ^ 0xff) & 1) != 0) {
        Hash = 0;
        while( true ) {
          local_369 = 0;
          if ((int)Hash < BitRate / 8) {
            local_369 = t._2_1_ ^ 0xff;
          }
          if ((local_369 & 1) == 0) break;
          plVar12 = (long *)std::istream::get(local_228);
          bVar4 = std::ios::operator_cast_to_bool
                            ((ios *)((long)plVar12 + *(long *)(*plVar12 + -0x18)));
          if (bVar4) {
            Absorb(state_main.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,(Sarray *)local_248,Hash
                  );
          }
          else {
            t._2_1_ = 1;
            pad((Sarray *)local_248,Hash);
          }
          Hash = Hash + 1;
        }
        RPerm((Sarray *)local_248,(Sarray *)local_298,
              (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,
              (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
      }
      std::ifstream::close();
      for (local_304 = 0; local_304 < iVar6 / 0x20; local_304 = local_304 + 1) {
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)&by,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         *)local_248);
        uVar8 = Squeeze((Sarray *)&by,local_304);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)&by);
        local_308 = uVar8;
        for (local_324 = 0; local_324 < 4; local_324 = local_324 + 1) {
          uVar9 = local_308 >> (((byte)local_324 & 3) << 3);
          uVar13 = std::ostream::operator<<((ostream *)&std::cout,std::hex);
          _Var5 = std::setfill<char>('0');
          poVar11 = std::operator<<(uVar13,_Var5._M_c);
          _Var10 = std::setw(2);
          poVar11 = std::operator<<(poVar11,_Var10);
          std::ostream::operator<<(poVar11,uVar9 & 0xff);
        }
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)local_298);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)local_248);
      std::ifstream::~ifstream(local_228);
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6f68);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]){
    if(argc < 2){
        cout << "Verwendung: ./Keccak [Output-Länge] [Datei]\nDer Output muss entweder 224, 256, 384 oder 512 Bits lang sein" << endl;
        return 0;
    }

    //Output-Länge&Bitrate
    int Hashlength = atoi(argv[1]);
    BitRate = 1600 - (2*Hashlength);

    if(Hashlength != 512 && Hashlength != 384 && Hashlength != 256 && Hashlength != 224){
        cout << "Verwendung: ./Keccak [Output-Länge] [Datei]\nDer Output muss entweder 224, 256, 384 oder 512 Bits lang sein" << endl;
        return 0;
    }

    ifstream InputDatei (argv[2], fstream::in|fstream::binary);
    char InputByte;

    //Arrays für die Permutationsfunktion
    vector< vector<uint64_t> > state_main (5, vector<uint64_t> (5, 0)); //State Array
    vector< vector<uint64_t> > state_alt (5, vector<uint64_t> (5, 0)); //Für Zwischenresultate in RPerm
    vector<uint64_t> TmpArr1 (5), TmpArr2 (5); //Für Zwischenresultate in Theta

    //Sponge-Konstruktion: Aufnahme & Verarbeitung der Daten
    bool DateiZuEnde = false;
    while(!DateiZuEnde){
        for(int i = 0; i < BitRate/8 && !DateiZuEnde; i++){
            if(InputDatei.get(InputByte)){
                Absorb(InputByte, state_main, i); //Nimmt das nächste Byte der Datei in das Zustandsarray auf
            }else{
                DateiZuEnde = true;
                pad(state_main, i);
            }
        }
        RPerm(state_main, state_alt, TmpArr1, TmpArr2);
    }
    InputDatei.close();

    //Hash-Output
    for(int t=0; t < Hashlength/32; t++){
        uint32_t Hash = Squeeze(state_main, t); //224/64 = 3.5 -> uint32_t statt uint64_t
        for(int b = 0; b < 4; b++){
            int by = (Hash >> 8*b) & 255;
            cout << hex << setfill('0') << setw(2) << by;
        }
    }
    cout << endl;

    return 0;
}